

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cpp
# Opt level: O0

void __thiscall SGParser::Generator::StdGrammarStackElement::Cleanup(StdGrammarStackElement *this)

{
  String *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  vector<SGParser::Generator::StdGrammarStackElement,_std::allocator<SGParser::Generator::StdGrammarStackElement>_>
  *pvVar1;
  bool bVar2;
  uint uVar3;
  reference this_02;
  StdGrammarStackElement *se;
  iterator __end3;
  iterator __begin3;
  vector<SGParser::Generator::StdGrammarStackElement,_std::allocator<SGParser::Generator::StdGrammarStackElement>_>
  *__range3;
  StdGrammarStackElement *this_local;
  
  if ((this->field_1).pData != (void *)0x0) {
    uVar3 = this->Type & 0xf0000000;
    if (uVar3 == 0x10000000) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/ParseData.cpp"
                    ,0x206,"void SGParser::Generator::StdGrammarStackElement::Cleanup()");
    }
    if (uVar3 == 0x20000000) {
      this_00 = (this->field_1).pString;
      if (this_00 != (String *)0x0) {
        std::__cxx11::string::~string((string *)this_00);
        operator_delete(this_00,0x20);
      }
    }
    else if (uVar3 == 0x30000000) {
      this_01 = (this->field_1).pStringVec;
      if (this_01 !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(this_01);
        operator_delete(this_01,0x18);
      }
    }
    else if (uVar3 == 0x40000000) {
      Cleanup((this->field_1).pStackElement);
      if ((this->field_1).pData != (void *)0x0) {
        operator_delete((this->field_1).pData,0x38);
      }
    }
    else if (uVar3 == 0x50000000) {
      pvVar1 = (this->field_1).pStackElementVec;
      __end3 = std::
               vector<SGParser::Generator::StdGrammarStackElement,_std::allocator<SGParser::Generator::StdGrammarStackElement>_>
               ::begin(pvVar1);
      se = (StdGrammarStackElement *)
           std::
           vector<SGParser::Generator::StdGrammarStackElement,_std::allocator<SGParser::Generator::StdGrammarStackElement>_>
           ::end(pvVar1);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<SGParser::Generator::StdGrammarStackElement_*,_std::vector<SGParser::Generator::StdGrammarStackElement,_std::allocator<SGParser::Generator::StdGrammarStackElement>_>_>
                                         *)&se), bVar2) {
        this_02 = __gnu_cxx::
                  __normal_iterator<SGParser::Generator::StdGrammarStackElement_*,_std::vector<SGParser::Generator::StdGrammarStackElement,_std::allocator<SGParser::Generator::StdGrammarStackElement>_>_>
                  ::operator*(&__end3);
        Cleanup(this_02);
        __gnu_cxx::
        __normal_iterator<SGParser::Generator::StdGrammarStackElement_*,_std::vector<SGParser::Generator::StdGrammarStackElement,_std::allocator<SGParser::Generator::StdGrammarStackElement>_>_>
        ::operator++(&__end3);
      }
      pvVar1 = (this->field_1).pStackElementVec;
      if (pvVar1 != (vector<SGParser::Generator::StdGrammarStackElement,_std::allocator<SGParser::Generator::StdGrammarStackElement>_>
                     *)0x0) {
        std::
        vector<SGParser::Generator::StdGrammarStackElement,_std::allocator<SGParser::Generator::StdGrammarStackElement>_>
        ::~vector(pvVar1);
        operator_delete(pvVar1,0x18);
      }
    }
    (this->field_1).pData = (void *)0x0;
  }
  return;
}

Assistant:

void Cleanup() {
        if (!pData)
            return;

        switch (Type & DataTypeMask) {
            case DataVoid:      SG_ASSERT(false);  break; // Shouldn't be here
            case DataString:    delete pString;    break;
            case DataStringVec: delete pStringVec; break;

            case DataStackElement:
                pStackElement->Cleanup();
                delete pStackElement;
                break;

            case DataStackElementVec:
                for (auto& se : *pStackElementVec)
                    se.Cleanup();
                delete pStackElementVec;
                break;
        }

        pData = nullptr;
    }